

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  undefined1 auVar13 [16];
  undefined1 auVar27 [16];
  undefined1 auVar35 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  auVar12 = _DAT_00515e10;
  do {
    uVar1 = *(ulong *)mask;
    auVar35[0] = (char)uVar1;
    cVar20 = (char)(uVar1 >> 8);
    cVar21 = (char)(uVar1 >> 0x10);
    cVar22 = (char)(uVar1 >> 0x18);
    cVar23 = (char)(uVar1 >> 0x20);
    cVar24 = (char)(uVar1 >> 0x28);
    cVar25 = (char)(uVar1 >> 0x30);
    cVar26 = (char)(uVar1 >> 0x38);
    uVar2 = *(ulong *)src0;
    uVar3 = *(undefined8 *)src1;
    auVar34._8_6_ = 0;
    auVar34._0_8_ = uVar2;
    auVar34[0xe] = (char)(uVar2 >> 0x38);
    auVar34[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar33._14_2_ = auVar34._14_2_;
    auVar33._8_5_ = 0;
    auVar33._0_8_ = uVar2;
    auVar33[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar32._13_3_ = auVar33._13_3_;
    auVar32._8_4_ = 0;
    auVar32._0_8_ = uVar2;
    auVar32[0xc] = (char)(uVar2 >> 0x30);
    auVar31._12_4_ = auVar32._12_4_;
    auVar31._8_3_ = 0;
    auVar31._0_8_ = uVar2;
    auVar31[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar30._11_5_ = auVar31._11_5_;
    auVar30._8_2_ = 0;
    auVar30._0_8_ = uVar2;
    auVar30[10] = (char)(uVar2 >> 0x28);
    auVar29._10_6_ = auVar30._10_6_;
    auVar29[8] = 0;
    auVar29._0_8_ = uVar2;
    auVar29[9] = (char)((ulong)uVar3 >> 0x20);
    auVar28._9_7_ = auVar29._9_7_;
    auVar28[8] = (char)(uVar2 >> 0x20);
    auVar28._0_8_ = uVar2;
    auVar27._8_8_ = auVar28._8_8_;
    auVar27[7] = (char)((ulong)uVar3 >> 0x18);
    auVar27[6] = (char)(uVar2 >> 0x18);
    auVar27[5] = (char)((ulong)uVar3 >> 0x10);
    auVar27[4] = (char)(uVar2 >> 0x10);
    auVar27[3] = (char)((ulong)uVar3 >> 8);
    auVar27[2] = (char)(uVar2 >> 8);
    auVar27[0] = (undefined1)uVar2;
    auVar27[1] = (char)uVar3;
    auVar19._8_6_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19[0xe] = cVar26;
    auVar19[0xf] = '@' - cVar26;
    auVar18._14_2_ = auVar19._14_2_;
    auVar18._8_5_ = 0;
    auVar18._0_8_ = uVar1;
    auVar18[0xd] = '@' - cVar25;
    auVar17._13_3_ = auVar18._13_3_;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar1;
    auVar17[0xc] = cVar25;
    auVar16._12_4_ = auVar17._12_4_;
    auVar16._8_3_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16[0xb] = '@' - cVar24;
    auVar15._11_5_ = auVar16._11_5_;
    auVar15._8_2_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15[10] = cVar24;
    auVar14._10_6_ = auVar15._10_6_;
    auVar14[8] = 0;
    auVar14._0_8_ = uVar1;
    auVar14[9] = '@' - cVar23;
    auVar13._9_7_ = auVar14._9_7_;
    auVar13[8] = cVar23;
    auVar13._0_8_ = uVar1;
    auVar35._8_8_ = auVar13._8_8_;
    auVar35[7] = '@' - cVar22;
    auVar35[6] = cVar22;
    auVar35[5] = '@' - cVar21;
    auVar35[4] = cVar21;
    auVar35[3] = '@' - cVar20;
    auVar35[2] = cVar20;
    auVar35[1] = '@' - auVar35[0];
    auVar35 = pmaddubsw(auVar27,auVar35);
    auVar35 = pmulhrsw(auVar35,auVar12);
    sVar4 = auVar35._0_2_;
    sVar5 = auVar35._2_2_;
    sVar6 = auVar35._4_2_;
    sVar7 = auVar35._6_2_;
    sVar8 = auVar35._8_2_;
    sVar9 = auVar35._10_2_;
    sVar10 = auVar35._12_2_;
    sVar11 = auVar35._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar35[0xe] - (0xff < sVar11),
                  CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar35[0xc] - (0xff < sVar10),
                           CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar35[10] - (0xff < sVar9),
                                    CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar35[8] -
                                             (0xff < sVar8),
                                             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar35[6] -
                                                      (0xff < sVar7),
                                                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                               auVar35[4] - (0xff < sVar6),
                                                               CONCAT11((0 < sVar5) *
                                                                        (sVar5 < 0x100) * auVar35[2]
                                                                        - (0xff < sVar5),
                                                                        (0 < sVar4) *
                                                                        (sVar4 < 0x100) * auVar35[0]
                                                                        - (0xff < sVar4))))))));
    dst = dst + dst_stride;
    src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
    src1 = src1 + src1_stride;
    mask = (uint8_t *)((long)mask + (ulong)mask_stride);
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_w8_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                     const uint8_t *src0, uint32_t src0_stride,
                                     const uint8_t *src1, uint32_t src1_stride,
                                     const uint8_t *mask, uint32_t mask_stride,
                                     int w, int h) {
  (void)w;
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_m0_b = xx_loadl_64(mask);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
    const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);
    xx_storel_64(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}